

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O1

void __thiscall hbm::streaming::Controller::execute(Controller *this,Value *request)

{
  bool bVar1;
  Int IVar2;
  long *plVar3;
  Value *pVVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  size_t in_RCX;
  size_type *psVar7;
  Value result;
  string response;
  string requestString;
  ostringstream msg;
  Reader reader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  Value local_330;
  string local_308;
  undefined1 local_2e8 [64];
  FastWriter local_2a8 [7];
  Reader local_130;
  
  Json::FastWriter::FastWriter(local_2a8);
  Json::FastWriter::write_abi_cxx11_((FastWriter *)local_2e8,(int)local_2a8,request,in_RCX);
  Json::FastWriter::~FastWriter(local_2a8);
  HttpPost::execute(&local_308,&this->m_httpPost,(string *)local_2e8);
  Json::Value::Value(&local_330,nullValue);
  Json::Reader::Reader(&local_130);
  bVar1 = Json::Reader::parse(&local_130,&local_308,&local_330,true);
  if (!bVar1) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    Json::Reader::getFormattedErrorMessages_abi_cxx11_((string *)(local_2e8 + 0x20),&local_130);
    std::operator+(&local_350,"http response is not valid JSON \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2e8 + 0x20));
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_350);
    local_2a8[0].super_Writer._vptr_Writer = (_func_int **)*plVar3;
    psVar7 = (size_type *)(plVar3 + 2);
    if (local_2a8[0].super_Writer._vptr_Writer == (_func_int **)psVar7) {
      local_2a8[0].document_._M_string_length = *psVar7;
      local_2a8[0].document_.field_2._0_8_ = plVar3[3];
      local_2a8[0].super_Writer._vptr_Writer =
           (_func_int **)&local_2a8[0].document_._M_string_length;
    }
    else {
      local_2a8[0].document_._M_string_length = *psVar7;
    }
    local_2a8[0].document_._M_dataplus._M_p = (pointer)plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)local_2a8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = Json::Value::isMember(&local_330,"error");
  if (!bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.commentsBefore_._M_dataplus._M_p != &local_130.commentsBefore_.field_2) {
      operator_delete(local_130.commentsBefore_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.document_._M_dataplus._M_p != &local_130.document_.field_2) {
      operator_delete(local_130.document_._M_dataplus._M_p);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              (&local_130.errors_);
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_130);
    Json::Value::~Value(&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
      operator_delete((void *)local_2e8._0_8_);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a8,"http response contains error: code=",0x23);
  pVVar4 = Json::Value::operator[](&local_330,"error");
  pVVar4 = Json::Value::operator[](pVVar4,"code");
  IVar2 = Json::Value::asInt(pVVar4);
  poVar5 = (ostream *)std::ostream::operator<<(local_2a8,IVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," \'",2);
  pVVar4 = Json::Value::operator[](&local_330,"error");
  pVVar4 = Json::Value::operator[](pVVar4,"message");
  Json::Value::asString_abi_cxx11_(&local_350,pVVar4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_350._M_dataplus._M_p,local_350._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)&local_350);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Controller::execute(const Json::Value &request)
		{
			std::string requestString = Json::FastWriter().write(request);

			std::string response = m_httpPost.execute(requestString);

			Json::Value result;
			Json::Reader reader;
			if(reader.parse(response, result)==false) {
				throw std::runtime_error("http response is not valid JSON '" + reader.getFormattedErrorMessages() + "'");
			}
			if(result.isMember(ERROR)) {
				std::ostringstream msg;
				msg << "http response contains error: code=" << result[ERROR]["code"].asInt() << " '" << result[ERROR]["message"].asString() << "'";
				throw std::runtime_error(msg.str());
			}
		}